

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseMarkupDecl(xmlParserCtxtPtr ctxt)

{
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  if (*ctxt->input->cur == '<') {
    if (ctxt->input->cur[1] == '!') {
      switch(ctxt->input->cur[2]) {
      case '-':
        xmlParseComment(ctxt);
        break;
      default:
        ctxt->input->cur = ctxt->input->cur + 2;
        ctxt->input->col = ctxt->input->col + 2;
        if (*ctxt->input->cur == '\0') {
          xmlParserGrow(ctxt);
        }
        break;
      case 'A':
        xmlParseAttributeListDecl(ctxt);
        break;
      case 'E':
        if (ctxt->input->cur[3] == 'L') {
          xmlParseElementDecl(ctxt);
        }
        else if (ctxt->input->cur[3] == 'N') {
          xmlParseEntityDecl(ctxt);
        }
        else {
          ctxt->input->cur = ctxt->input->cur + 2;
          ctxt->input->col = ctxt->input->col + 2;
          if (*ctxt->input->cur == '\0') {
            xmlParserGrow(ctxt);
          }
        }
        break;
      case 'N':
        xmlParseNotationDecl(ctxt);
      }
    }
    else if (ctxt->input->cur[1] == '?') {
      xmlParsePI(ctxt);
    }
  }
  return;
}

Assistant:

void
xmlParseMarkupDecl(xmlParserCtxtPtr ctxt) {
    GROW;
    if (CUR == '<') {
        if (NXT(1) == '!') {
	    switch (NXT(2)) {
	        case 'E':
		    if (NXT(3) == 'L')
			xmlParseElementDecl(ctxt);
		    else if (NXT(3) == 'N')
			xmlParseEntityDecl(ctxt);
                    else
                        SKIP(2);
		    break;
	        case 'A':
		    xmlParseAttributeListDecl(ctxt);
		    break;
	        case 'N':
		    xmlParseNotationDecl(ctxt);
		    break;
	        case '-':
		    xmlParseComment(ctxt);
		    break;
		default:
		    /* there is an error but it will be detected later */
                    SKIP(2);
		    break;
	    }
	} else if (NXT(1) == '?') {
	    xmlParsePI(ctxt);
	}
    }
}